

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

int av1_get_sbq_variance_boost(AV1_COMP *cpi,MACROBLOCK *x)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  double dVar3;
  int sb_qindex;
  int boost;
  int target_qindex;
  double target_q;
  double base_q;
  double qstep_ratio;
  uint variance;
  int strength;
  aom_bit_depth_t bit_depth;
  int base_qindex;
  AV1_COMMON *cm;
  MACROBLOCK *in_stack_000000e8;
  AV1_COMP *in_stack_000000f0;
  aom_bit_depth_t in_stack_ffffffffffffffa8;
  aom_bit_depth_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint local_28;
  
  iVar2 = *(int *)(in_RDI + 0x3c1e8);
  local_28 = av1_get_variance_boost_block_variance(in_stack_000000f0,in_stack_000000e8);
  if (local_28 == 0) {
    local_28 = 1;
  }
  dVar3 = log2((double)local_28);
  fclamp((-dVar3 + 10.0) * 0.44999999999999996 + 1.0,1.0,8.0);
  av1_convert_qindex_to_q(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  iVar1 = av1_convert_q_to_qindex
                    ((double)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac);
  dVar3 = round((((double)iVar2 + 544.0) * (double)(iVar2 - iVar1)) / 1279.0);
  iVar1 = (int)dVar3;
  if (0x50 < iVar1) {
    iVar1 = 0x50;
  }
  if (iVar2 - iVar1 < 2) {
    iVar2 = 1;
  }
  else {
    iVar2 = iVar2 - iVar1;
  }
  return iVar2;
}

Assistant:

int av1_get_sbq_variance_boost(const AV1_COMP *cpi, const MACROBLOCK *x) {
  const AV1_COMMON *cm = &cpi->common;
  const int base_qindex = cm->quant_params.base_qindex;
  const aom_bit_depth_t bit_depth = cm->seq_params->bit_depth;

  // Variance Boost only supports 64x64 SBs.
  assert(cm->seq_params->sb_size == BLOCK_64X64);

  // Strength is currently hard-coded and optimized for still pictures. In the
  // future, we might want to expose this as a parameter that can be fine-tuned
  // by the caller.
  const int strength = 3;
  unsigned int variance = av1_get_variance_boost_block_variance(cpi, x);

  // Variance = 0 areas are either completely flat patches or have very fine
  // gradients. Boost these blocks as if they have a variance of 1.
  if (variance == 0) {
    variance = 1;
  }

  // Compute a boost based on a fast-growing formula.
  // High and medium variance SBs essentially get no boost, while lower variance
  // SBs get increasingly stronger boosts.
  assert(strength >= 1 && strength <= 4);

  // Still picture curve, with variance crossover point at 1024.
  double qstep_ratio = 0.15 * strength * (-log2((double)variance) + 10.0) + 1.0;
  qstep_ratio = fclamp(qstep_ratio, 1.0, VAR_BOOST_MAX_BOOST);

  double base_q = av1_convert_qindex_to_q(base_qindex, bit_depth);
  double target_q = base_q / qstep_ratio;
  int target_qindex = av1_convert_q_to_qindex(target_q, bit_depth);

  // Determine the SB's delta_q boost by computing an (unscaled) delta_q from
  // the base and target q values, then scale that delta_q according to the
  // frame's base qindex.
  // The scaling coefficients were chosen empirically to maximize SSIMULACRA 2
  // scores, 10th percentile scores, and subjective quality. Boosts become
  // smaller (for a given variance) the lower the base qindex.
  int boost = (int)round((base_qindex + 544.0) * (base_qindex - target_qindex) /
                         1279.0);
  boost = AOMMIN(VAR_BOOST_MAX_DELTAQ_RANGE, boost);

  // Variance Boost was designed to always operate in the lossy domain, so MINQ
  // is excluded.
  int sb_qindex = AOMMAX(base_qindex - boost, MINQ + 1);

  return sb_qindex;
}